

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * __thiscall
czh::utils::to_czhstr<std::__cxx11::string>
          (string *__return_storage_ptr__,utils *this,string *val,Color color)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char __c;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    __c = *(char *)(lVar1 + lVar3);
    switch(__c) {
    case '\b':
      __c = 'b';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'\\');
      break;
    case '\t':
      __c = 't';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'\\');
      break;
    case '\n':
      __c = 'n';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'\\');
      break;
    case '\v':
      break;
    case '\f':
      __c = 'f';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'\\');
      break;
    case '\r':
      __c = 'r';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'\\');
      break;
    default:
      if (__c == '\\') {
        __c = '\\';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&ret,'\\');
      }
      else if (__c == '\"') {
        __c = '\"';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&ret,'\\');
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&ret,__c);
  }
  std::operator+(&local_70,"\"",&ret);
  std::operator+(&local_50,&local_70,"\"");
  colorify(__return_storage_ptr__,&local_50,(Color)val,STR);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string to_czhstr(const std::string &val, Color color)
  {
    std::string ret;
    for (auto &r: val)
    {
      switch (r)
      {
        case '\"':
          ret += '\\';
          ret += '\"';
          break;
        case '\\':
          ret += '\\';
          ret += '\\';
          break;
        case '\b':
          ret += '\\';
          ret += 'b';
          break;
        case '\f':
          ret += '\\';
          ret += 'f';
          break;
        case '\n':
          ret += '\\';
          ret += 'n';
          break;
        case '\r':
          ret += '\\';
          ret += 'r';
          break;
        case '\t':
          ret += '\\';
          ret += 't';
          break;
        default:
          ret += r;
          break;
      }
    }
    return colorify(("\"" + ret + "\""), color, ColorType::STR);
  }